

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O1

void col_txfm_16x16_rounding(__m128i *in,int shift)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  undefined1 auVar14 [16];
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  __m128i rounding;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  
  iVar1 = 1 << ((char)shift - 1U & 0x1f);
  iVar15 = (int)(*in)[0] + iVar1;
  iVar16 = *(int *)((long)*in + 4) + iVar1;
  iVar17 = (int)(*in)[1] + iVar1;
  iVar18 = *(int *)((long)*in + 0xc) + iVar1;
  *(int *)*in = iVar15;
  *(int *)((long)*in + 4) = iVar16;
  *(int *)(*in + 1) = iVar17;
  *(int *)((long)*in + 0xc) = iVar18;
  iVar2 = (int)in[1][0] + iVar1;
  iVar5 = *(int *)((long)in[1] + 4) + iVar1;
  iVar8 = (int)in[1][1] + iVar1;
  iVar11 = *(int *)((long)in[1] + 0xc) + iVar1;
  *(int *)in[1] = iVar2;
  *(int *)((long)in[1] + 4) = iVar5;
  *(int *)(in[1] + 1) = iVar8;
  *(int *)((long)in[1] + 0xc) = iVar11;
  iVar3 = (int)in[2][0] + iVar1;
  iVar6 = *(int *)((long)in[2] + 4) + iVar1;
  iVar9 = (int)in[2][1] + iVar1;
  iVar12 = *(int *)((long)in[2] + 0xc) + iVar1;
  *(int *)in[2] = iVar3;
  *(int *)((long)in[2] + 4) = iVar6;
  *(int *)(in[2] + 1) = iVar9;
  *(int *)((long)in[2] + 0xc) = iVar12;
  iVar27 = (int)in[3][0] + iVar1;
  iVar28 = *(int *)((long)in[3] + 4) + iVar1;
  iVar29 = (int)in[3][1] + iVar1;
  iVar30 = *(int *)((long)in[3] + 0xc) + iVar1;
  *(int *)in[3] = iVar27;
  *(int *)((long)in[3] + 4) = iVar28;
  *(int *)(in[3] + 1) = iVar29;
  *(int *)((long)in[3] + 0xc) = iVar30;
  iVar4 = (int)in[4][0] + iVar1;
  iVar7 = *(int *)((long)in[4] + 4) + iVar1;
  iVar10 = (int)in[4][1] + iVar1;
  iVar13 = *(int *)((long)in[4] + 0xc) + iVar1;
  *(int *)in[4] = iVar4;
  *(int *)((long)in[4] + 4) = iVar7;
  *(int *)(in[4] + 1) = iVar10;
  *(int *)((long)in[4] + 0xc) = iVar13;
  iVar31 = (int)in[5][0] + iVar1;
  iVar32 = *(int *)((long)in[5] + 4) + iVar1;
  iVar33 = (int)in[5][1] + iVar1;
  iVar34 = *(int *)((long)in[5] + 0xc) + iVar1;
  *(int *)in[5] = iVar31;
  *(int *)((long)in[5] + 4) = iVar32;
  *(int *)(in[5] + 1) = iVar33;
  *(int *)((long)in[5] + 0xc) = iVar34;
  iVar39 = (int)in[6][0] + iVar1;
  iVar40 = *(int *)((long)in[6] + 4) + iVar1;
  iVar41 = (int)in[6][1] + iVar1;
  iVar42 = *(int *)((long)in[6] + 0xc) + iVar1;
  *(int *)in[6] = iVar39;
  *(int *)((long)in[6] + 4) = iVar40;
  *(int *)(in[6] + 1) = iVar41;
  *(int *)((long)in[6] + 0xc) = iVar42;
  iVar43 = (int)in[7][0] + iVar1;
  iVar44 = *(int *)((long)in[7] + 4) + iVar1;
  iVar45 = (int)in[7][1] + iVar1;
  iVar46 = *(int *)((long)in[7] + 0xc) + iVar1;
  *(int *)in[7] = iVar43;
  *(int *)((long)in[7] + 4) = iVar44;
  *(int *)(in[7] + 1) = iVar45;
  *(int *)((long)in[7] + 0xc) = iVar46;
  iVar35 = (int)in[8][0] + iVar1;
  iVar36 = *(int *)((long)in[8] + 4) + iVar1;
  iVar37 = (int)in[8][1] + iVar1;
  iVar38 = *(int *)((long)in[8] + 0xc) + iVar1;
  *(int *)in[8] = iVar35;
  *(int *)((long)in[8] + 4) = iVar36;
  *(int *)(in[8] + 1) = iVar37;
  *(int *)((long)in[8] + 0xc) = iVar38;
  iVar47 = (int)in[9][0] + iVar1;
  iVar48 = *(int *)((long)in[9] + 4) + iVar1;
  iVar49 = (int)in[9][1] + iVar1;
  iVar50 = *(int *)((long)in[9] + 0xc) + iVar1;
  *(int *)in[9] = iVar47;
  *(int *)((long)in[9] + 4) = iVar48;
  *(int *)(in[9] + 1) = iVar49;
  *(int *)((long)in[9] + 0xc) = iVar50;
  iVar55 = (int)in[10][0] + iVar1;
  iVar56 = *(int *)((long)in[10] + 4) + iVar1;
  iVar57 = (int)in[10][1] + iVar1;
  iVar58 = *(int *)((long)in[10] + 0xc) + iVar1;
  *(int *)in[10] = iVar55;
  *(int *)((long)in[10] + 4) = iVar56;
  *(int *)(in[10] + 1) = iVar57;
  *(int *)((long)in[10] + 0xc) = iVar58;
  iVar59 = (int)in[0xb][0] + iVar1;
  iVar60 = *(int *)((long)in[0xb] + 4) + iVar1;
  iVar61 = (int)in[0xb][1] + iVar1;
  iVar62 = *(int *)((long)in[0xb] + 0xc) + iVar1;
  *(int *)in[0xb] = iVar59;
  *(int *)((long)in[0xb] + 4) = iVar60;
  *(int *)(in[0xb] + 1) = iVar61;
  *(int *)((long)in[0xb] + 0xc) = iVar62;
  iVar51 = (int)in[0xc][0] + iVar1;
  iVar52 = *(int *)((long)in[0xc] + 4) + iVar1;
  iVar53 = (int)in[0xc][1] + iVar1;
  iVar54 = *(int *)((long)in[0xc] + 0xc) + iVar1;
  *(int *)in[0xc] = iVar51;
  *(int *)((long)in[0xc] + 4) = iVar52;
  *(int *)(in[0xc] + 1) = iVar53;
  *(int *)((long)in[0xc] + 0xc) = iVar54;
  iVar63 = (int)in[0xd][0] + iVar1;
  iVar64 = *(int *)((long)in[0xd] + 4) + iVar1;
  iVar65 = (int)in[0xd][1] + iVar1;
  iVar66 = *(int *)((long)in[0xd] + 0xc) + iVar1;
  *(int *)in[0xd] = iVar63;
  *(int *)((long)in[0xd] + 4) = iVar64;
  *(int *)(in[0xd] + 1) = iVar65;
  *(int *)((long)in[0xd] + 0xc) = iVar66;
  iVar23 = (int)in[0xe][0] + iVar1;
  iVar24 = *(int *)((long)in[0xe] + 4) + iVar1;
  iVar25 = (int)in[0xe][1] + iVar1;
  iVar26 = *(int *)((long)in[0xe] + 0xc) + iVar1;
  *(int *)in[0xe] = iVar23;
  *(int *)((long)in[0xe] + 4) = iVar24;
  *(int *)(in[0xe] + 1) = iVar25;
  *(int *)((long)in[0xe] + 0xc) = iVar26;
  iVar19 = (int)in[0xf][0] + iVar1;
  iVar20 = *(int *)((long)in[0xf] + 4) + iVar1;
  iVar21 = (int)in[0xf][1] + iVar1;
  iVar22 = *(int *)((long)in[0xf] + 0xc) + iVar1;
  *(int *)in[0xf] = iVar19;
  *(int *)((long)in[0xf] + 4) = iVar20;
  *(int *)(in[0xf] + 1) = iVar21;
  *(int *)((long)in[0xf] + 0xc) = iVar22;
  auVar14 = ZEXT416((uint)shift);
  *(int *)*in = iVar15 >> auVar14;
  *(int *)((long)*in + 4) = iVar16 >> auVar14;
  *(int *)(*in + 1) = iVar17 >> auVar14;
  *(int *)((long)*in + 0xc) = iVar18 >> auVar14;
  *(int *)in[1] = iVar2 >> auVar14;
  *(int *)((long)in[1] + 4) = iVar5 >> auVar14;
  *(int *)(in[1] + 1) = iVar8 >> auVar14;
  *(int *)((long)in[1] + 0xc) = iVar11 >> auVar14;
  *(int *)in[2] = iVar3 >> auVar14;
  *(int *)((long)in[2] + 4) = iVar6 >> auVar14;
  *(int *)(in[2] + 1) = iVar9 >> auVar14;
  *(int *)((long)in[2] + 0xc) = iVar12 >> auVar14;
  *(int *)in[3] = iVar27 >> auVar14;
  *(int *)((long)in[3] + 4) = iVar28 >> auVar14;
  *(int *)(in[3] + 1) = iVar29 >> auVar14;
  *(int *)((long)in[3] + 0xc) = iVar30 >> auVar14;
  *(int *)in[4] = iVar4 >> auVar14;
  *(int *)((long)in[4] + 4) = iVar7 >> auVar14;
  *(int *)(in[4] + 1) = iVar10 >> auVar14;
  *(int *)((long)in[4] + 0xc) = iVar13 >> auVar14;
  *(int *)in[5] = iVar31 >> auVar14;
  *(int *)((long)in[5] + 4) = iVar32 >> auVar14;
  *(int *)(in[5] + 1) = iVar33 >> auVar14;
  *(int *)((long)in[5] + 0xc) = iVar34 >> auVar14;
  *(int *)in[6] = iVar39 >> auVar14;
  *(int *)((long)in[6] + 4) = iVar40 >> auVar14;
  *(int *)(in[6] + 1) = iVar41 >> auVar14;
  *(int *)((long)in[6] + 0xc) = iVar42 >> auVar14;
  *(int *)in[7] = iVar43 >> auVar14;
  *(int *)((long)in[7] + 4) = iVar44 >> auVar14;
  *(int *)(in[7] + 1) = iVar45 >> auVar14;
  *(int *)((long)in[7] + 0xc) = iVar46 >> auVar14;
  *(int *)in[8] = iVar35 >> auVar14;
  *(int *)((long)in[8] + 4) = iVar36 >> auVar14;
  *(int *)(in[8] + 1) = iVar37 >> auVar14;
  *(int *)((long)in[8] + 0xc) = iVar38 >> auVar14;
  *(int *)in[9] = iVar47 >> auVar14;
  *(int *)((long)in[9] + 4) = iVar48 >> auVar14;
  *(int *)(in[9] + 1) = iVar49 >> auVar14;
  *(int *)((long)in[9] + 0xc) = iVar50 >> auVar14;
  *(int *)in[10] = iVar55 >> auVar14;
  *(int *)((long)in[10] + 4) = iVar56 >> auVar14;
  *(int *)(in[10] + 1) = iVar57 >> auVar14;
  *(int *)((long)in[10] + 0xc) = iVar58 >> auVar14;
  *(int *)in[0xb] = iVar59 >> auVar14;
  *(int *)((long)in[0xb] + 4) = iVar60 >> auVar14;
  *(int *)(in[0xb] + 1) = iVar61 >> auVar14;
  *(int *)((long)in[0xb] + 0xc) = iVar62 >> auVar14;
  *(int *)in[0xc] = iVar51 >> auVar14;
  *(int *)((long)in[0xc] + 4) = iVar52 >> auVar14;
  *(int *)(in[0xc] + 1) = iVar53 >> auVar14;
  *(int *)((long)in[0xc] + 0xc) = iVar54 >> auVar14;
  *(int *)in[0xd] = iVar63 >> auVar14;
  *(int *)((long)in[0xd] + 4) = iVar64 >> auVar14;
  *(int *)(in[0xd] + 1) = iVar65 >> auVar14;
  *(int *)((long)in[0xd] + 0xc) = iVar66 >> auVar14;
  *(int *)in[0xe] = iVar23 >> auVar14;
  *(int *)((long)in[0xe] + 4) = iVar24 >> auVar14;
  *(int *)(in[0xe] + 1) = iVar25 >> auVar14;
  *(int *)((long)in[0xe] + 0xc) = iVar26 >> auVar14;
  *(int *)in[0xf] = iVar19 >> auVar14;
  *(int *)((long)in[0xf] + 4) = iVar20 >> auVar14;
  *(int *)(in[0xf] + 1) = iVar21 >> auVar14;
  *(int *)((long)in[0xf] + 0xc) = iVar22 >> auVar14;
  iVar2 = (int)in[0x10][0] + iVar1;
  iVar6 = *(int *)((long)in[0x10] + 4) + iVar1;
  iVar10 = (int)in[0x10][1] + iVar1;
  iVar15 = *(int *)((long)in[0x10] + 0xc) + iVar1;
  *(int *)in[0x10] = iVar2;
  *(int *)((long)in[0x10] + 4) = iVar6;
  *(int *)(in[0x10] + 1) = iVar10;
  *(int *)((long)in[0x10] + 0xc) = iVar15;
  iVar3 = (int)in[0x11][0] + iVar1;
  iVar7 = *(int *)((long)in[0x11] + 4) + iVar1;
  iVar11 = (int)in[0x11][1] + iVar1;
  iVar16 = *(int *)((long)in[0x11] + 0xc) + iVar1;
  *(int *)in[0x11] = iVar3;
  *(int *)((long)in[0x11] + 4) = iVar7;
  *(int *)(in[0x11] + 1) = iVar11;
  *(int *)((long)in[0x11] + 0xc) = iVar16;
  iVar4 = (int)in[0x12][0] + iVar1;
  iVar8 = *(int *)((long)in[0x12] + 4) + iVar1;
  iVar12 = (int)in[0x12][1] + iVar1;
  iVar17 = *(int *)((long)in[0x12] + 0xc) + iVar1;
  *(int *)in[0x12] = iVar4;
  *(int *)((long)in[0x12] + 4) = iVar8;
  *(int *)(in[0x12] + 1) = iVar12;
  *(int *)((long)in[0x12] + 0xc) = iVar17;
  iVar27 = (int)in[0x13][0] + iVar1;
  iVar28 = *(int *)((long)in[0x13] + 4) + iVar1;
  iVar29 = (int)in[0x13][1] + iVar1;
  iVar30 = *(int *)((long)in[0x13] + 0xc) + iVar1;
  *(int *)in[0x13] = iVar27;
  *(int *)((long)in[0x13] + 4) = iVar28;
  *(int *)(in[0x13] + 1) = iVar29;
  *(int *)((long)in[0x13] + 0xc) = iVar30;
  iVar5 = (int)in[0x14][0] + iVar1;
  iVar9 = *(int *)((long)in[0x14] + 4) + iVar1;
  iVar13 = (int)in[0x14][1] + iVar1;
  iVar18 = *(int *)((long)in[0x14] + 0xc) + iVar1;
  *(int *)in[0x14] = iVar5;
  *(int *)((long)in[0x14] + 4) = iVar9;
  *(int *)(in[0x14] + 1) = iVar13;
  *(int *)((long)in[0x14] + 0xc) = iVar18;
  iVar31 = (int)in[0x15][0] + iVar1;
  iVar32 = *(int *)((long)in[0x15] + 4) + iVar1;
  iVar33 = (int)in[0x15][1] + iVar1;
  iVar34 = *(int *)((long)in[0x15] + 0xc) + iVar1;
  *(int *)in[0x15] = iVar31;
  *(int *)((long)in[0x15] + 4) = iVar32;
  *(int *)(in[0x15] + 1) = iVar33;
  *(int *)((long)in[0x15] + 0xc) = iVar34;
  iVar39 = (int)in[0x16][0] + iVar1;
  iVar40 = *(int *)((long)in[0x16] + 4) + iVar1;
  iVar41 = (int)in[0x16][1] + iVar1;
  iVar42 = *(int *)((long)in[0x16] + 0xc) + iVar1;
  *(int *)in[0x16] = iVar39;
  *(int *)((long)in[0x16] + 4) = iVar40;
  *(int *)(in[0x16] + 1) = iVar41;
  *(int *)((long)in[0x16] + 0xc) = iVar42;
  iVar43 = (int)in[0x17][0] + iVar1;
  iVar44 = *(int *)((long)in[0x17] + 4) + iVar1;
  iVar45 = (int)in[0x17][1] + iVar1;
  iVar46 = *(int *)((long)in[0x17] + 0xc) + iVar1;
  *(int *)in[0x17] = iVar43;
  *(int *)((long)in[0x17] + 4) = iVar44;
  *(int *)(in[0x17] + 1) = iVar45;
  *(int *)((long)in[0x17] + 0xc) = iVar46;
  iVar35 = (int)in[0x18][0] + iVar1;
  iVar36 = *(int *)((long)in[0x18] + 4) + iVar1;
  iVar37 = (int)in[0x18][1] + iVar1;
  iVar38 = *(int *)((long)in[0x18] + 0xc) + iVar1;
  *(int *)in[0x18] = iVar35;
  *(int *)((long)in[0x18] + 4) = iVar36;
  *(int *)(in[0x18] + 1) = iVar37;
  *(int *)((long)in[0x18] + 0xc) = iVar38;
  iVar47 = (int)in[0x19][0] + iVar1;
  iVar48 = *(int *)((long)in[0x19] + 4) + iVar1;
  iVar49 = (int)in[0x19][1] + iVar1;
  iVar50 = *(int *)((long)in[0x19] + 0xc) + iVar1;
  *(int *)in[0x19] = iVar47;
  *(int *)((long)in[0x19] + 4) = iVar48;
  *(int *)(in[0x19] + 1) = iVar49;
  *(int *)((long)in[0x19] + 0xc) = iVar50;
  iVar55 = (int)in[0x1a][0] + iVar1;
  iVar56 = *(int *)((long)in[0x1a] + 4) + iVar1;
  iVar57 = (int)in[0x1a][1] + iVar1;
  iVar58 = *(int *)((long)in[0x1a] + 0xc) + iVar1;
  *(int *)in[0x1a] = iVar55;
  *(int *)((long)in[0x1a] + 4) = iVar56;
  *(int *)(in[0x1a] + 1) = iVar57;
  *(int *)((long)in[0x1a] + 0xc) = iVar58;
  iVar59 = (int)in[0x1b][0] + iVar1;
  iVar60 = *(int *)((long)in[0x1b] + 4) + iVar1;
  iVar61 = (int)in[0x1b][1] + iVar1;
  iVar62 = *(int *)((long)in[0x1b] + 0xc) + iVar1;
  *(int *)in[0x1b] = iVar59;
  *(int *)((long)in[0x1b] + 4) = iVar60;
  *(int *)(in[0x1b] + 1) = iVar61;
  *(int *)((long)in[0x1b] + 0xc) = iVar62;
  iVar51 = (int)in[0x1c][0] + iVar1;
  iVar52 = *(int *)((long)in[0x1c] + 4) + iVar1;
  iVar53 = (int)in[0x1c][1] + iVar1;
  iVar54 = *(int *)((long)in[0x1c] + 0xc) + iVar1;
  *(int *)in[0x1c] = iVar51;
  *(int *)((long)in[0x1c] + 4) = iVar52;
  *(int *)(in[0x1c] + 1) = iVar53;
  *(int *)((long)in[0x1c] + 0xc) = iVar54;
  iVar63 = (int)in[0x1d][0] + iVar1;
  iVar64 = *(int *)((long)in[0x1d] + 4) + iVar1;
  iVar65 = (int)in[0x1d][1] + iVar1;
  iVar66 = *(int *)((long)in[0x1d] + 0xc) + iVar1;
  *(int *)in[0x1d] = iVar63;
  *(int *)((long)in[0x1d] + 4) = iVar64;
  *(int *)(in[0x1d] + 1) = iVar65;
  *(int *)((long)in[0x1d] + 0xc) = iVar66;
  iVar23 = (int)in[0x1e][0] + iVar1;
  iVar24 = *(int *)((long)in[0x1e] + 4) + iVar1;
  iVar25 = (int)in[0x1e][1] + iVar1;
  iVar26 = *(int *)((long)in[0x1e] + 0xc) + iVar1;
  *(int *)in[0x1e] = iVar23;
  *(int *)((long)in[0x1e] + 4) = iVar24;
  *(int *)(in[0x1e] + 1) = iVar25;
  *(int *)((long)in[0x1e] + 0xc) = iVar26;
  iVar19 = (int)in[0x1f][0] + iVar1;
  iVar20 = *(int *)((long)in[0x1f] + 4) + iVar1;
  iVar21 = (int)in[0x1f][1] + iVar1;
  iVar22 = *(int *)((long)in[0x1f] + 0xc) + iVar1;
  *(int *)in[0x1f] = iVar19;
  *(int *)((long)in[0x1f] + 4) = iVar20;
  *(int *)(in[0x1f] + 1) = iVar21;
  *(int *)((long)in[0x1f] + 0xc) = iVar22;
  *(int *)in[0x10] = iVar2 >> auVar14;
  *(int *)((long)in[0x10] + 4) = iVar6 >> auVar14;
  *(int *)(in[0x10] + 1) = iVar10 >> auVar14;
  *(int *)((long)in[0x10] + 0xc) = iVar15 >> auVar14;
  *(int *)in[0x11] = iVar3 >> auVar14;
  *(int *)((long)in[0x11] + 4) = iVar7 >> auVar14;
  *(int *)(in[0x11] + 1) = iVar11 >> auVar14;
  *(int *)((long)in[0x11] + 0xc) = iVar16 >> auVar14;
  *(int *)in[0x12] = iVar4 >> auVar14;
  *(int *)((long)in[0x12] + 4) = iVar8 >> auVar14;
  *(int *)(in[0x12] + 1) = iVar12 >> auVar14;
  *(int *)((long)in[0x12] + 0xc) = iVar17 >> auVar14;
  *(int *)in[0x13] = iVar27 >> auVar14;
  *(int *)((long)in[0x13] + 4) = iVar28 >> auVar14;
  *(int *)(in[0x13] + 1) = iVar29 >> auVar14;
  *(int *)((long)in[0x13] + 0xc) = iVar30 >> auVar14;
  *(int *)in[0x14] = iVar5 >> auVar14;
  *(int *)((long)in[0x14] + 4) = iVar9 >> auVar14;
  *(int *)(in[0x14] + 1) = iVar13 >> auVar14;
  *(int *)((long)in[0x14] + 0xc) = iVar18 >> auVar14;
  *(int *)in[0x15] = iVar31 >> auVar14;
  *(int *)((long)in[0x15] + 4) = iVar32 >> auVar14;
  *(int *)(in[0x15] + 1) = iVar33 >> auVar14;
  *(int *)((long)in[0x15] + 0xc) = iVar34 >> auVar14;
  *(int *)in[0x16] = iVar39 >> auVar14;
  *(int *)((long)in[0x16] + 4) = iVar40 >> auVar14;
  *(int *)(in[0x16] + 1) = iVar41 >> auVar14;
  *(int *)((long)in[0x16] + 0xc) = iVar42 >> auVar14;
  *(int *)in[0x17] = iVar43 >> auVar14;
  *(int *)((long)in[0x17] + 4) = iVar44 >> auVar14;
  *(int *)(in[0x17] + 1) = iVar45 >> auVar14;
  *(int *)((long)in[0x17] + 0xc) = iVar46 >> auVar14;
  *(int *)in[0x18] = iVar35 >> auVar14;
  *(int *)((long)in[0x18] + 4) = iVar36 >> auVar14;
  *(int *)(in[0x18] + 1) = iVar37 >> auVar14;
  *(int *)((long)in[0x18] + 0xc) = iVar38 >> auVar14;
  *(int *)in[0x19] = iVar47 >> auVar14;
  *(int *)((long)in[0x19] + 4) = iVar48 >> auVar14;
  *(int *)(in[0x19] + 1) = iVar49 >> auVar14;
  *(int *)((long)in[0x19] + 0xc) = iVar50 >> auVar14;
  *(int *)in[0x1a] = iVar55 >> auVar14;
  *(int *)((long)in[0x1a] + 4) = iVar56 >> auVar14;
  *(int *)(in[0x1a] + 1) = iVar57 >> auVar14;
  *(int *)((long)in[0x1a] + 0xc) = iVar58 >> auVar14;
  *(int *)in[0x1b] = iVar59 >> auVar14;
  *(int *)((long)in[0x1b] + 4) = iVar60 >> auVar14;
  *(int *)(in[0x1b] + 1) = iVar61 >> auVar14;
  *(int *)((long)in[0x1b] + 0xc) = iVar62 >> auVar14;
  *(int *)in[0x1c] = iVar51 >> auVar14;
  *(int *)((long)in[0x1c] + 4) = iVar52 >> auVar14;
  *(int *)(in[0x1c] + 1) = iVar53 >> auVar14;
  *(int *)((long)in[0x1c] + 0xc) = iVar54 >> auVar14;
  *(int *)in[0x1d] = iVar63 >> auVar14;
  *(int *)((long)in[0x1d] + 4) = iVar64 >> auVar14;
  *(int *)(in[0x1d] + 1) = iVar65 >> auVar14;
  *(int *)((long)in[0x1d] + 0xc) = iVar66 >> auVar14;
  *(int *)in[0x1e] = iVar23 >> auVar14;
  *(int *)((long)in[0x1e] + 4) = iVar24 >> auVar14;
  *(int *)(in[0x1e] + 1) = iVar25 >> auVar14;
  *(int *)((long)in[0x1e] + 0xc) = iVar26 >> auVar14;
  *(int *)in[0x1f] = iVar19 >> auVar14;
  *(int *)((long)in[0x1f] + 4) = iVar20 >> auVar14;
  *(int *)(in[0x1f] + 1) = iVar21 >> auVar14;
  *(int *)((long)in[0x1f] + 0xc) = iVar22 >> auVar14;
  iVar2 = (int)in[0x20][0] + iVar1;
  iVar6 = *(int *)((long)in[0x20] + 4) + iVar1;
  iVar10 = (int)in[0x20][1] + iVar1;
  iVar15 = *(int *)((long)in[0x20] + 0xc) + iVar1;
  *(int *)in[0x20] = iVar2;
  *(int *)((long)in[0x20] + 4) = iVar6;
  *(int *)(in[0x20] + 1) = iVar10;
  *(int *)((long)in[0x20] + 0xc) = iVar15;
  iVar3 = (int)in[0x21][0] + iVar1;
  iVar7 = *(int *)((long)in[0x21] + 4) + iVar1;
  iVar11 = (int)in[0x21][1] + iVar1;
  iVar16 = *(int *)((long)in[0x21] + 0xc) + iVar1;
  *(int *)in[0x21] = iVar3;
  *(int *)((long)in[0x21] + 4) = iVar7;
  *(int *)(in[0x21] + 1) = iVar11;
  *(int *)((long)in[0x21] + 0xc) = iVar16;
  iVar4 = (int)in[0x22][0] + iVar1;
  iVar8 = *(int *)((long)in[0x22] + 4) + iVar1;
  iVar12 = (int)in[0x22][1] + iVar1;
  iVar17 = *(int *)((long)in[0x22] + 0xc) + iVar1;
  *(int *)in[0x22] = iVar4;
  *(int *)((long)in[0x22] + 4) = iVar8;
  *(int *)(in[0x22] + 1) = iVar12;
  *(int *)((long)in[0x22] + 0xc) = iVar17;
  iVar27 = (int)in[0x23][0] + iVar1;
  iVar28 = *(int *)((long)in[0x23] + 4) + iVar1;
  iVar29 = (int)in[0x23][1] + iVar1;
  iVar30 = *(int *)((long)in[0x23] + 0xc) + iVar1;
  *(int *)in[0x23] = iVar27;
  *(int *)((long)in[0x23] + 4) = iVar28;
  *(int *)(in[0x23] + 1) = iVar29;
  *(int *)((long)in[0x23] + 0xc) = iVar30;
  iVar5 = (int)in[0x24][0] + iVar1;
  iVar9 = *(int *)((long)in[0x24] + 4) + iVar1;
  iVar13 = (int)in[0x24][1] + iVar1;
  iVar18 = *(int *)((long)in[0x24] + 0xc) + iVar1;
  *(int *)in[0x24] = iVar5;
  *(int *)((long)in[0x24] + 4) = iVar9;
  *(int *)(in[0x24] + 1) = iVar13;
  *(int *)((long)in[0x24] + 0xc) = iVar18;
  iVar31 = (int)in[0x25][0] + iVar1;
  iVar32 = *(int *)((long)in[0x25] + 4) + iVar1;
  iVar33 = (int)in[0x25][1] + iVar1;
  iVar34 = *(int *)((long)in[0x25] + 0xc) + iVar1;
  *(int *)in[0x25] = iVar31;
  *(int *)((long)in[0x25] + 4) = iVar32;
  *(int *)(in[0x25] + 1) = iVar33;
  *(int *)((long)in[0x25] + 0xc) = iVar34;
  iVar39 = (int)in[0x26][0] + iVar1;
  iVar40 = *(int *)((long)in[0x26] + 4) + iVar1;
  iVar41 = (int)in[0x26][1] + iVar1;
  iVar42 = *(int *)((long)in[0x26] + 0xc) + iVar1;
  *(int *)in[0x26] = iVar39;
  *(int *)((long)in[0x26] + 4) = iVar40;
  *(int *)(in[0x26] + 1) = iVar41;
  *(int *)((long)in[0x26] + 0xc) = iVar42;
  iVar43 = (int)in[0x27][0] + iVar1;
  iVar44 = *(int *)((long)in[0x27] + 4) + iVar1;
  iVar45 = (int)in[0x27][1] + iVar1;
  iVar46 = *(int *)((long)in[0x27] + 0xc) + iVar1;
  *(int *)in[0x27] = iVar43;
  *(int *)((long)in[0x27] + 4) = iVar44;
  *(int *)(in[0x27] + 1) = iVar45;
  *(int *)((long)in[0x27] + 0xc) = iVar46;
  iVar35 = (int)in[0x28][0] + iVar1;
  iVar36 = *(int *)((long)in[0x28] + 4) + iVar1;
  iVar37 = (int)in[0x28][1] + iVar1;
  iVar38 = *(int *)((long)in[0x28] + 0xc) + iVar1;
  *(int *)in[0x28] = iVar35;
  *(int *)((long)in[0x28] + 4) = iVar36;
  *(int *)(in[0x28] + 1) = iVar37;
  *(int *)((long)in[0x28] + 0xc) = iVar38;
  iVar47 = (int)in[0x29][0] + iVar1;
  iVar48 = *(int *)((long)in[0x29] + 4) + iVar1;
  iVar49 = (int)in[0x29][1] + iVar1;
  iVar50 = *(int *)((long)in[0x29] + 0xc) + iVar1;
  *(int *)in[0x29] = iVar47;
  *(int *)((long)in[0x29] + 4) = iVar48;
  *(int *)(in[0x29] + 1) = iVar49;
  *(int *)((long)in[0x29] + 0xc) = iVar50;
  iVar55 = (int)in[0x2a][0] + iVar1;
  iVar56 = *(int *)((long)in[0x2a] + 4) + iVar1;
  iVar57 = (int)in[0x2a][1] + iVar1;
  iVar58 = *(int *)((long)in[0x2a] + 0xc) + iVar1;
  *(int *)in[0x2a] = iVar55;
  *(int *)((long)in[0x2a] + 4) = iVar56;
  *(int *)(in[0x2a] + 1) = iVar57;
  *(int *)((long)in[0x2a] + 0xc) = iVar58;
  iVar59 = (int)in[0x2b][0] + iVar1;
  iVar60 = *(int *)((long)in[0x2b] + 4) + iVar1;
  iVar61 = (int)in[0x2b][1] + iVar1;
  iVar62 = *(int *)((long)in[0x2b] + 0xc) + iVar1;
  *(int *)in[0x2b] = iVar59;
  *(int *)((long)in[0x2b] + 4) = iVar60;
  *(int *)(in[0x2b] + 1) = iVar61;
  *(int *)((long)in[0x2b] + 0xc) = iVar62;
  iVar51 = (int)in[0x2c][0] + iVar1;
  iVar52 = *(int *)((long)in[0x2c] + 4) + iVar1;
  iVar53 = (int)in[0x2c][1] + iVar1;
  iVar54 = *(int *)((long)in[0x2c] + 0xc) + iVar1;
  *(int *)in[0x2c] = iVar51;
  *(int *)((long)in[0x2c] + 4) = iVar52;
  *(int *)(in[0x2c] + 1) = iVar53;
  *(int *)((long)in[0x2c] + 0xc) = iVar54;
  iVar63 = (int)in[0x2d][0] + iVar1;
  iVar64 = *(int *)((long)in[0x2d] + 4) + iVar1;
  iVar65 = (int)in[0x2d][1] + iVar1;
  iVar66 = *(int *)((long)in[0x2d] + 0xc) + iVar1;
  *(int *)in[0x2d] = iVar63;
  *(int *)((long)in[0x2d] + 4) = iVar64;
  *(int *)(in[0x2d] + 1) = iVar65;
  *(int *)((long)in[0x2d] + 0xc) = iVar66;
  iVar23 = (int)in[0x2e][0] + iVar1;
  iVar24 = *(int *)((long)in[0x2e] + 4) + iVar1;
  iVar25 = (int)in[0x2e][1] + iVar1;
  iVar26 = *(int *)((long)in[0x2e] + 0xc) + iVar1;
  *(int *)in[0x2e] = iVar23;
  *(int *)((long)in[0x2e] + 4) = iVar24;
  *(int *)(in[0x2e] + 1) = iVar25;
  *(int *)((long)in[0x2e] + 0xc) = iVar26;
  iVar19 = (int)in[0x2f][0] + iVar1;
  iVar20 = *(int *)((long)in[0x2f] + 4) + iVar1;
  iVar21 = (int)in[0x2f][1] + iVar1;
  iVar22 = *(int *)((long)in[0x2f] + 0xc) + iVar1;
  *(int *)in[0x2f] = iVar19;
  *(int *)((long)in[0x2f] + 4) = iVar20;
  *(int *)(in[0x2f] + 1) = iVar21;
  *(int *)((long)in[0x2f] + 0xc) = iVar22;
  *(int *)in[0x20] = iVar2 >> auVar14;
  *(int *)((long)in[0x20] + 4) = iVar6 >> auVar14;
  *(int *)(in[0x20] + 1) = iVar10 >> auVar14;
  *(int *)((long)in[0x20] + 0xc) = iVar15 >> auVar14;
  *(int *)in[0x21] = iVar3 >> auVar14;
  *(int *)((long)in[0x21] + 4) = iVar7 >> auVar14;
  *(int *)(in[0x21] + 1) = iVar11 >> auVar14;
  *(int *)((long)in[0x21] + 0xc) = iVar16 >> auVar14;
  *(int *)in[0x22] = iVar4 >> auVar14;
  *(int *)((long)in[0x22] + 4) = iVar8 >> auVar14;
  *(int *)(in[0x22] + 1) = iVar12 >> auVar14;
  *(int *)((long)in[0x22] + 0xc) = iVar17 >> auVar14;
  *(int *)in[0x23] = iVar27 >> auVar14;
  *(int *)((long)in[0x23] + 4) = iVar28 >> auVar14;
  *(int *)(in[0x23] + 1) = iVar29 >> auVar14;
  *(int *)((long)in[0x23] + 0xc) = iVar30 >> auVar14;
  *(int *)in[0x24] = iVar5 >> auVar14;
  *(int *)((long)in[0x24] + 4) = iVar9 >> auVar14;
  *(int *)(in[0x24] + 1) = iVar13 >> auVar14;
  *(int *)((long)in[0x24] + 0xc) = iVar18 >> auVar14;
  *(int *)in[0x25] = iVar31 >> auVar14;
  *(int *)((long)in[0x25] + 4) = iVar32 >> auVar14;
  *(int *)(in[0x25] + 1) = iVar33 >> auVar14;
  *(int *)((long)in[0x25] + 0xc) = iVar34 >> auVar14;
  *(int *)in[0x26] = iVar39 >> auVar14;
  *(int *)((long)in[0x26] + 4) = iVar40 >> auVar14;
  *(int *)(in[0x26] + 1) = iVar41 >> auVar14;
  *(int *)((long)in[0x26] + 0xc) = iVar42 >> auVar14;
  *(int *)in[0x27] = iVar43 >> auVar14;
  *(int *)((long)in[0x27] + 4) = iVar44 >> auVar14;
  *(int *)(in[0x27] + 1) = iVar45 >> auVar14;
  *(int *)((long)in[0x27] + 0xc) = iVar46 >> auVar14;
  *(int *)in[0x28] = iVar35 >> auVar14;
  *(int *)((long)in[0x28] + 4) = iVar36 >> auVar14;
  *(int *)(in[0x28] + 1) = iVar37 >> auVar14;
  *(int *)((long)in[0x28] + 0xc) = iVar38 >> auVar14;
  *(int *)in[0x29] = iVar47 >> auVar14;
  *(int *)((long)in[0x29] + 4) = iVar48 >> auVar14;
  *(int *)(in[0x29] + 1) = iVar49 >> auVar14;
  *(int *)((long)in[0x29] + 0xc) = iVar50 >> auVar14;
  *(int *)in[0x2a] = iVar55 >> auVar14;
  *(int *)((long)in[0x2a] + 4) = iVar56 >> auVar14;
  *(int *)(in[0x2a] + 1) = iVar57 >> auVar14;
  *(int *)((long)in[0x2a] + 0xc) = iVar58 >> auVar14;
  *(int *)in[0x2b] = iVar59 >> auVar14;
  *(int *)((long)in[0x2b] + 4) = iVar60 >> auVar14;
  *(int *)(in[0x2b] + 1) = iVar61 >> auVar14;
  *(int *)((long)in[0x2b] + 0xc) = iVar62 >> auVar14;
  *(int *)in[0x2c] = iVar51 >> auVar14;
  *(int *)((long)in[0x2c] + 4) = iVar52 >> auVar14;
  *(int *)(in[0x2c] + 1) = iVar53 >> auVar14;
  *(int *)((long)in[0x2c] + 0xc) = iVar54 >> auVar14;
  *(int *)in[0x2d] = iVar63 >> auVar14;
  *(int *)((long)in[0x2d] + 4) = iVar64 >> auVar14;
  *(int *)(in[0x2d] + 1) = iVar65 >> auVar14;
  *(int *)((long)in[0x2d] + 0xc) = iVar66 >> auVar14;
  *(int *)in[0x2e] = iVar23 >> auVar14;
  *(int *)((long)in[0x2e] + 4) = iVar24 >> auVar14;
  *(int *)(in[0x2e] + 1) = iVar25 >> auVar14;
  *(int *)((long)in[0x2e] + 0xc) = iVar26 >> auVar14;
  *(int *)in[0x2f] = iVar19 >> auVar14;
  *(int *)((long)in[0x2f] + 4) = iVar20 >> auVar14;
  *(int *)(in[0x2f] + 1) = iVar21 >> auVar14;
  *(int *)((long)in[0x2f] + 0xc) = iVar22 >> auVar14;
  iVar2 = (int)in[0x30][0] + iVar1;
  iVar5 = *(int *)((long)in[0x30] + 4) + iVar1;
  iVar8 = (int)in[0x30][1] + iVar1;
  iVar11 = *(int *)((long)in[0x30] + 0xc) + iVar1;
  *(int *)in[0x30] = iVar2;
  *(int *)((long)in[0x30] + 4) = iVar5;
  *(int *)(in[0x30] + 1) = iVar8;
  *(int *)((long)in[0x30] + 0xc) = iVar11;
  iVar3 = (int)in[0x31][0] + iVar1;
  iVar6 = *(int *)((long)in[0x31] + 4) + iVar1;
  iVar9 = (int)in[0x31][1] + iVar1;
  iVar12 = *(int *)((long)in[0x31] + 0xc) + iVar1;
  *(int *)in[0x31] = iVar3;
  *(int *)((long)in[0x31] + 4) = iVar6;
  *(int *)(in[0x31] + 1) = iVar9;
  *(int *)((long)in[0x31] + 0xc) = iVar12;
  iVar22 = (int)in[0x32][0] + iVar1;
  iVar23 = *(int *)((long)in[0x32] + 4) + iVar1;
  iVar24 = (int)in[0x32][1] + iVar1;
  iVar25 = *(int *)((long)in[0x32] + 0xc) + iVar1;
  *(int *)in[0x32] = iVar22;
  *(int *)((long)in[0x32] + 4) = iVar23;
  *(int *)(in[0x32] + 1) = iVar24;
  *(int *)((long)in[0x32] + 0xc) = iVar25;
  iVar26 = (int)in[0x33][0] + iVar1;
  iVar27 = *(int *)((long)in[0x33] + 4) + iVar1;
  iVar28 = (int)in[0x33][1] + iVar1;
  iVar29 = *(int *)((long)in[0x33] + 0xc) + iVar1;
  *(int *)in[0x33] = iVar26;
  *(int *)((long)in[0x33] + 4) = iVar27;
  *(int *)(in[0x33] + 1) = iVar28;
  *(int *)((long)in[0x33] + 0xc) = iVar29;
  iVar4 = (int)in[0x34][0] + iVar1;
  iVar7 = *(int *)((long)in[0x34] + 4) + iVar1;
  iVar10 = (int)in[0x34][1] + iVar1;
  iVar13 = *(int *)((long)in[0x34] + 0xc) + iVar1;
  *(int *)in[0x34] = iVar4;
  *(int *)((long)in[0x34] + 4) = iVar7;
  *(int *)(in[0x34] + 1) = iVar10;
  *(int *)((long)in[0x34] + 0xc) = iVar13;
  iVar30 = (int)in[0x35][0] + iVar1;
  iVar31 = *(int *)((long)in[0x35] + 4) + iVar1;
  iVar32 = (int)in[0x35][1] + iVar1;
  iVar33 = *(int *)((long)in[0x35] + 0xc) + iVar1;
  *(int *)in[0x35] = iVar30;
  *(int *)((long)in[0x35] + 4) = iVar31;
  *(int *)(in[0x35] + 1) = iVar32;
  *(int *)((long)in[0x35] + 0xc) = iVar33;
  iVar38 = (int)in[0x36][0] + iVar1;
  iVar39 = *(int *)((long)in[0x36] + 4) + iVar1;
  iVar40 = (int)in[0x36][1] + iVar1;
  iVar41 = *(int *)((long)in[0x36] + 0xc) + iVar1;
  *(int *)in[0x36] = iVar38;
  *(int *)((long)in[0x36] + 4) = iVar39;
  *(int *)(in[0x36] + 1) = iVar40;
  *(int *)((long)in[0x36] + 0xc) = iVar41;
  iVar42 = (int)in[0x37][0] + iVar1;
  iVar43 = *(int *)((long)in[0x37] + 4) + iVar1;
  iVar44 = (int)in[0x37][1] + iVar1;
  iVar45 = *(int *)((long)in[0x37] + 0xc) + iVar1;
  *(int *)in[0x37] = iVar42;
  *(int *)((long)in[0x37] + 4) = iVar43;
  *(int *)(in[0x37] + 1) = iVar44;
  *(int *)((long)in[0x37] + 0xc) = iVar45;
  iVar34 = (int)in[0x38][0] + iVar1;
  iVar35 = *(int *)((long)in[0x38] + 4) + iVar1;
  iVar36 = (int)in[0x38][1] + iVar1;
  iVar37 = *(int *)((long)in[0x38] + 0xc) + iVar1;
  *(int *)in[0x38] = iVar34;
  *(int *)((long)in[0x38] + 4) = iVar35;
  *(int *)(in[0x38] + 1) = iVar36;
  *(int *)((long)in[0x38] + 0xc) = iVar37;
  iVar46 = (int)in[0x39][0] + iVar1;
  iVar47 = *(int *)((long)in[0x39] + 4) + iVar1;
  iVar48 = (int)in[0x39][1] + iVar1;
  iVar49 = *(int *)((long)in[0x39] + 0xc) + iVar1;
  *(int *)in[0x39] = iVar46;
  *(int *)((long)in[0x39] + 4) = iVar47;
  *(int *)(in[0x39] + 1) = iVar48;
  *(int *)((long)in[0x39] + 0xc) = iVar49;
  iVar54 = (int)in[0x3a][0] + iVar1;
  iVar55 = *(int *)((long)in[0x3a] + 4) + iVar1;
  iVar56 = (int)in[0x3a][1] + iVar1;
  iVar57 = *(int *)((long)in[0x3a] + 0xc) + iVar1;
  *(int *)in[0x3a] = iVar54;
  *(int *)((long)in[0x3a] + 4) = iVar55;
  *(int *)(in[0x3a] + 1) = iVar56;
  *(int *)((long)in[0x3a] + 0xc) = iVar57;
  iVar58 = (int)in[0x3b][0] + iVar1;
  iVar59 = *(int *)((long)in[0x3b] + 4) + iVar1;
  iVar60 = (int)in[0x3b][1] + iVar1;
  iVar61 = *(int *)((long)in[0x3b] + 0xc) + iVar1;
  *(int *)in[0x3b] = iVar58;
  *(int *)((long)in[0x3b] + 4) = iVar59;
  *(int *)(in[0x3b] + 1) = iVar60;
  *(int *)((long)in[0x3b] + 0xc) = iVar61;
  iVar50 = (int)in[0x3c][0] + iVar1;
  iVar51 = *(int *)((long)in[0x3c] + 4) + iVar1;
  iVar52 = (int)in[0x3c][1] + iVar1;
  iVar53 = *(int *)((long)in[0x3c] + 0xc) + iVar1;
  *(int *)in[0x3c] = iVar50;
  *(int *)((long)in[0x3c] + 4) = iVar51;
  *(int *)(in[0x3c] + 1) = iVar52;
  *(int *)((long)in[0x3c] + 0xc) = iVar53;
  iVar62 = (int)in[0x3d][0] + iVar1;
  iVar63 = *(int *)((long)in[0x3d] + 4) + iVar1;
  iVar64 = (int)in[0x3d][1] + iVar1;
  iVar65 = *(int *)((long)in[0x3d] + 0xc) + iVar1;
  *(int *)in[0x3d] = iVar62;
  *(int *)((long)in[0x3d] + 4) = iVar63;
  *(int *)(in[0x3d] + 1) = iVar64;
  *(int *)((long)in[0x3d] + 0xc) = iVar65;
  iVar18 = (int)in[0x3e][0] + iVar1;
  iVar19 = *(int *)((long)in[0x3e] + 4) + iVar1;
  iVar20 = (int)in[0x3e][1] + iVar1;
  iVar21 = *(int *)((long)in[0x3e] + 0xc) + iVar1;
  *(int *)in[0x3e] = iVar18;
  *(int *)((long)in[0x3e] + 4) = iVar19;
  *(int *)(in[0x3e] + 1) = iVar20;
  *(int *)((long)in[0x3e] + 0xc) = iVar21;
  iVar15 = iVar1 + (int)in[0x3f][0];
  iVar16 = iVar1 + *(int *)((long)in[0x3f] + 4);
  iVar17 = iVar1 + (int)in[0x3f][1];
  iVar1 = iVar1 + *(int *)((long)in[0x3f] + 0xc);
  *(int *)in[0x3f] = iVar15;
  *(int *)((long)in[0x3f] + 4) = iVar16;
  *(int *)(in[0x3f] + 1) = iVar17;
  *(int *)((long)in[0x3f] + 0xc) = iVar1;
  *(int *)in[0x30] = iVar2 >> auVar14;
  *(int *)((long)in[0x30] + 4) = iVar5 >> auVar14;
  *(int *)(in[0x30] + 1) = iVar8 >> auVar14;
  *(int *)((long)in[0x30] + 0xc) = iVar11 >> auVar14;
  *(int *)in[0x31] = iVar3 >> auVar14;
  *(int *)((long)in[0x31] + 4) = iVar6 >> auVar14;
  *(int *)(in[0x31] + 1) = iVar9 >> auVar14;
  *(int *)((long)in[0x31] + 0xc) = iVar12 >> auVar14;
  *(int *)in[0x32] = iVar22 >> auVar14;
  *(int *)((long)in[0x32] + 4) = iVar23 >> auVar14;
  *(int *)(in[0x32] + 1) = iVar24 >> auVar14;
  *(int *)((long)in[0x32] + 0xc) = iVar25 >> auVar14;
  *(int *)in[0x33] = iVar26 >> auVar14;
  *(int *)((long)in[0x33] + 4) = iVar27 >> auVar14;
  *(int *)(in[0x33] + 1) = iVar28 >> auVar14;
  *(int *)((long)in[0x33] + 0xc) = iVar29 >> auVar14;
  *(int *)in[0x34] = iVar4 >> auVar14;
  *(int *)((long)in[0x34] + 4) = iVar7 >> auVar14;
  *(int *)(in[0x34] + 1) = iVar10 >> auVar14;
  *(int *)((long)in[0x34] + 0xc) = iVar13 >> auVar14;
  *(int *)in[0x35] = iVar30 >> auVar14;
  *(int *)((long)in[0x35] + 4) = iVar31 >> auVar14;
  *(int *)(in[0x35] + 1) = iVar32 >> auVar14;
  *(int *)((long)in[0x35] + 0xc) = iVar33 >> auVar14;
  *(int *)in[0x36] = iVar38 >> auVar14;
  *(int *)((long)in[0x36] + 4) = iVar39 >> auVar14;
  *(int *)(in[0x36] + 1) = iVar40 >> auVar14;
  *(int *)((long)in[0x36] + 0xc) = iVar41 >> auVar14;
  *(int *)in[0x37] = iVar42 >> auVar14;
  *(int *)((long)in[0x37] + 4) = iVar43 >> auVar14;
  *(int *)(in[0x37] + 1) = iVar44 >> auVar14;
  *(int *)((long)in[0x37] + 0xc) = iVar45 >> auVar14;
  *(int *)in[0x38] = iVar34 >> auVar14;
  *(int *)((long)in[0x38] + 4) = iVar35 >> auVar14;
  *(int *)(in[0x38] + 1) = iVar36 >> auVar14;
  *(int *)((long)in[0x38] + 0xc) = iVar37 >> auVar14;
  *(int *)in[0x39] = iVar46 >> auVar14;
  *(int *)((long)in[0x39] + 4) = iVar47 >> auVar14;
  *(int *)(in[0x39] + 1) = iVar48 >> auVar14;
  *(int *)((long)in[0x39] + 0xc) = iVar49 >> auVar14;
  *(int *)in[0x3a] = iVar54 >> auVar14;
  *(int *)((long)in[0x3a] + 4) = iVar55 >> auVar14;
  *(int *)(in[0x3a] + 1) = iVar56 >> auVar14;
  *(int *)((long)in[0x3a] + 0xc) = iVar57 >> auVar14;
  *(int *)in[0x3b] = iVar58 >> auVar14;
  *(int *)((long)in[0x3b] + 4) = iVar59 >> auVar14;
  *(int *)(in[0x3b] + 1) = iVar60 >> auVar14;
  *(int *)((long)in[0x3b] + 0xc) = iVar61 >> auVar14;
  *(int *)in[0x3c] = iVar50 >> auVar14;
  *(int *)((long)in[0x3c] + 4) = iVar51 >> auVar14;
  *(int *)(in[0x3c] + 1) = iVar52 >> auVar14;
  *(int *)((long)in[0x3c] + 0xc) = iVar53 >> auVar14;
  *(int *)in[0x3d] = iVar62 >> auVar14;
  *(int *)((long)in[0x3d] + 4) = iVar63 >> auVar14;
  *(int *)(in[0x3d] + 1) = iVar64 >> auVar14;
  *(int *)((long)in[0x3d] + 0xc) = iVar65 >> auVar14;
  *(int *)in[0x3e] = iVar18 >> auVar14;
  *(int *)((long)in[0x3e] + 4) = iVar19 >> auVar14;
  *(int *)(in[0x3e] + 1) = iVar20 >> auVar14;
  *(int *)((long)in[0x3e] + 0xc) = iVar21 >> auVar14;
  *(int *)in[0x3f] = iVar15 >> auVar14;
  *(int *)((long)in[0x3f] + 4) = iVar16 >> auVar14;
  *(int *)(in[0x3f] + 1) = iVar17 >> auVar14;
  *(int *)((long)in[0x3f] + 0xc) = iVar1 >> auVar14;
  return;
}

Assistant:

static inline void col_txfm_8x8_rounding(__m128i *in, int shift) {
  const __m128i rounding = _mm_set1_epi32(1 << (shift - 1));

  in[0] = _mm_add_epi32(in[0], rounding);
  in[1] = _mm_add_epi32(in[1], rounding);
  in[2] = _mm_add_epi32(in[2], rounding);
  in[3] = _mm_add_epi32(in[3], rounding);
  in[4] = _mm_add_epi32(in[4], rounding);
  in[5] = _mm_add_epi32(in[5], rounding);
  in[6] = _mm_add_epi32(in[6], rounding);
  in[7] = _mm_add_epi32(in[7], rounding);
  in[8] = _mm_add_epi32(in[8], rounding);
  in[9] = _mm_add_epi32(in[9], rounding);
  in[10] = _mm_add_epi32(in[10], rounding);
  in[11] = _mm_add_epi32(in[11], rounding);
  in[12] = _mm_add_epi32(in[12], rounding);
  in[13] = _mm_add_epi32(in[13], rounding);
  in[14] = _mm_add_epi32(in[14], rounding);
  in[15] = _mm_add_epi32(in[15], rounding);

  in[0] = _mm_srai_epi32(in[0], shift);
  in[1] = _mm_srai_epi32(in[1], shift);
  in[2] = _mm_srai_epi32(in[2], shift);
  in[3] = _mm_srai_epi32(in[3], shift);
  in[4] = _mm_srai_epi32(in[4], shift);
  in[5] = _mm_srai_epi32(in[5], shift);
  in[6] = _mm_srai_epi32(in[6], shift);
  in[7] = _mm_srai_epi32(in[7], shift);
  in[8] = _mm_srai_epi32(in[8], shift);
  in[9] = _mm_srai_epi32(in[9], shift);
  in[10] = _mm_srai_epi32(in[10], shift);
  in[11] = _mm_srai_epi32(in[11], shift);
  in[12] = _mm_srai_epi32(in[12], shift);
  in[13] = _mm_srai_epi32(in[13], shift);
  in[14] = _mm_srai_epi32(in[14], shift);
  in[15] = _mm_srai_epi32(in[15], shift);
}